

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

bool anon_unknown.dwarf_7df21::isRawStringLiteral(SyntaxKind syntaxK)

{
  SyntaxKind syntaxK_local;
  
  return (ushort)(syntaxK - StringLiteral_R_Token) < 5;
}

Assistant:

bool isRawStringLiteral(SyntaxKind syntaxK)
{
    switch (syntaxK) {
        case SyntaxKind::StringLiteral_R_Token:
        case SyntaxKind::StringLiteral_LR_Token:
        case SyntaxKind::StringLiteral_u8R_Token:
        case SyntaxKind::StringLiteral_uR_Token:
        case SyntaxKind::StringLiteral_UR_Token:
            return true;
        default:
            return false;
    }
}